

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeForces.cpp
# Opt level: O1

void __thiscall
OpenMD::FluctuatingChargeForces::FluctuatingChargeForces
          (FluctuatingChargeForces *this,SimInfo *info)

{
  _Rb_tree_header *p_Var1;
  
  this->info_ = info;
  p_Var1 = &(this->simTypes_)._M_t._M_impl.super__Rb_tree_header;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->data).vself_.polyPairMap_._M_t._M_impl.super__Rb_tree_header;
  (this->data).vself_.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->data).vself_.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->data).vself_.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) =
       p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->data).vself_.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
       p_Var1;
  (this->data).vself_.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->FQtypes)._M_t._M_impl.super__Rb_tree_header;
  (this->FQtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FQtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->FQtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FQtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->FQtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->FQtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->FQtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->FQtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->FQMap).
  super__Vector_base<OpenMD::FluctuatingChargeAtomData,_std::allocator<OpenMD::FluctuatingChargeAtomData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FQMap).
  super__Vector_base<OpenMD::FluctuatingChargeAtomData,_std::allocator<OpenMD::FluctuatingChargeAtomData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->FQMap).
           super__Vector_base<OpenMD::FluctuatingChargeAtomData,_std::allocator<OpenMD::FluctuatingChargeAtomData>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->FQMap).
           super__Vector_base<OpenMD::FluctuatingChargeAtomData,_std::allocator<OpenMD::FluctuatingChargeAtomData>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  return;
}

Assistant:

FluctuatingChargeForces::FluctuatingChargeForces(SimInfo* info) :
      info_(info), initialized_(false) {}